

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astIdentifierReferenceNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t value;
  sysbvm_tuple_t sVar2;
  anon_struct_40_5_c7ef10b2 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.binding = 0;
  gcFrame.symbolString = 0;
  gcFrame.analyzedNode = (sysbvm_astIdentifierReferenceNode_t *)0x0;
  gcFrame.expansionNode = 0;
  gcFrame.errorMessage = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 5;
  local_20 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_38);
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  _Var1 = sysbvm_analysisEnvironment_lookSymbolRecursively
                    (context,arguments[1],*(sysbvm_tuple_t *)(*arguments + 0x28),&gcFrame.binding);
  if (_Var1) {
    _Var1 = sysbvm_symbolBinding_isValue(context,gcFrame.binding);
    if (_Var1) {
      if (*(long *)(gcFrame.binding + 0x40) != 0x1f) {
        sysbvm_stackFrame_popRecord(&local_38);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
        sVar2 = *(sysbvm_tuple_t *)(*arguments + 0x10);
        value = sysbvm_symbolValueBinding_getValue(gcFrame.binding);
        sVar2 = sysbvm_astLiteralNode_create(context,sVar2,value);
        return sVar2;
      }
    }
    else {
      _Var1 = sysbvm_symbolBinding_isMacroValue(context,gcFrame.binding);
      if (_Var1) {
        gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
        sysbvm_stackFrame_popRecord(&local_38);
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
        sVar2 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                          (context,gcFrame.expansionNode,arguments[1]);
        return sVar2;
      }
    }
  }
  else {
    gcFrame.symbolString = sysbvm_tuple_printString(context,*(sysbvm_tuple_t *)(*arguments + 0x28));
    sVar2 = sysbvm_string_createWithCString(context,"Failed to find symbol binding for ");
    gcFrame.errorMessage = sysbvm_string_concat(context,sVar2,gcFrame.symbolString);
    sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
  }
  gcFrame.analyzedNode =
       (sysbvm_astIdentifierReferenceNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  (gcFrame.analyzedNode)->binding = gcFrame.binding;
  if ((gcFrame.binding & 0xf) == 0 && gcFrame.binding != 0) {
    sVar2 = *(sysbvm_tuple_t *)(gcFrame.binding + 0x30);
  }
  else {
    sVar2 = 0;
  }
  ((gcFrame.analyzedNode)->super).analyzedType = sVar2;
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.analyzedNode)->super).analyzerToken = sVar2;
  sysbvm_stackFrame_popRecord(&local_38);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  return (sysbvm_tuple_t)gcFrame.analyzedNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIdentifierReferenceNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astIdentifierReferenceNode_t **referenceNode = (sysbvm_astIdentifierReferenceNode_t**)node;

    struct {
        sysbvm_astIdentifierReferenceNode_t *analyzedNode;
        sysbvm_tuple_t expansionNode;
        sysbvm_tuple_t binding;
        sysbvm_tuple_t symbolString;
        sysbvm_tuple_t errorMessage;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*referenceNode)->super.sourcePosition);

    // Attempt to replace the symbol with its binding, if it exists.
    if(sysbvm_analysisEnvironment_lookSymbolRecursively(context, *environment, (*referenceNode)->value, &gcFrame.binding))
    {
        if(sysbvm_symbolBinding_isValue(context, gcFrame.binding))
        {
            // Preserve the references into mutable bindings.
            bool isMutable = sysbvm_tuple_boolean_decode(((sysbvm_symbolValueBinding_t*)gcFrame.binding)->isMutable);
            if(!isMutable)
            {
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                return sysbvm_astLiteralNode_create(context, (*referenceNode)->super.sourcePosition, sysbvm_symbolValueBinding_getValue(gcFrame.binding));
            }
        }
        else if(sysbvm_symbolBinding_isMacroValue(context, gcFrame.binding))
        {
            gcFrame.expansionNode = sysbvm_symbolMacroValueBinding_getExpansion(gcFrame.binding);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionNode, *environment);
        }
    }
    else
    {
        gcFrame.symbolString = sysbvm_tuple_printString(context, (*referenceNode)->value);
        gcFrame.errorMessage = sysbvm_string_concat(context, sysbvm_string_createWithCString(context, "Failed to find symbol binding for "), gcFrame.symbolString);
        sysbvm_errorWithMessageTuple(gcFrame.errorMessage);
    }

    gcFrame.analyzedNode = (sysbvm_astIdentifierReferenceNode_t*)sysbvm_context_shallowCopy(context, (sysbvm_tuple_t)*referenceNode);
    gcFrame.analyzedNode->binding = gcFrame.binding;
    gcFrame.analyzedNode->super.analyzedType = sysbvm_symbolBinding_getType(gcFrame.binding);
    gcFrame.analyzedNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    return (sysbvm_tuple_t)gcFrame.analyzedNode;
}